

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_test.cpp
# Opt level: O0

void test_files(shared_ptr<cppcms::sessions::session_storage> *storage,session_storage_factory *f)

{
  time_t tVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ostream *poVar6;
  runtime_error *prVar7;
  element_type *peVar8;
  long lVar9;
  long *in_RSI;
  ostringstream oss_9;
  ostringstream oss_8;
  ostringstream oss_7;
  ostringstream oss_6;
  ostringstream oss_5;
  time_t ttime;
  string tstr;
  ostringstream oss_4;
  ostringstream oss_3;
  ostringstream oss_2;
  ostringstream oss_1;
  time_t now;
  ostringstream oss;
  shared_ptr<cppcms::sessions::session_storage> *in_stack_ffffffffffffeb68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffeb70;
  char *in_stack_ffffffffffffeb90;
  undefined4 in_stack_ffffffffffffeb98;
  undefined4 in_stack_ffffffffffffeb9c;
  string local_1218 [32];
  ostringstream local_11f8 [383];
  undefined1 local_1079;
  string local_1078 [32];
  ostringstream local_1058 [383];
  allocator local_ed9;
  string local_ed8 [32];
  string local_eb8 [39];
  undefined1 local_e91;
  string local_e90 [32];
  ostringstream local_e70 [383];
  undefined1 local_cf1;
  string local_cf0 [32];
  ostringstream local_cd0 [376];
  string local_b58 [39];
  undefined1 local_b31;
  string local_b30 [32];
  ostringstream local_b10 [376];
  string local_998 [32];
  long local_978;
  string local_970 [39];
  undefined1 local_949;
  string local_948 [32];
  ostringstream local_928 [383];
  undefined1 local_7a9;
  string local_7a8 [32];
  ostringstream local_788 [383];
  allocator local_609;
  string local_608 [32];
  string local_5e8 [39];
  allocator local_5c1;
  string local_5c0 [32];
  string local_5a0 [39];
  undefined1 local_579;
  string local_578 [32];
  ostringstream local_558 [376];
  string local_3e0 [39];
  undefined1 local_3b9;
  string local_3b8 [32];
  ostringstream local_398 [383];
  allocator local_219;
  string local_218 [32];
  string local_1f8 [32];
  time_t local_1d8;
  undefined1 local_1c9;
  string local_1c8 [32];
  ostringstream local_1a8 [144];
  session_storage_factory *in_stack_fffffffffffffee8;
  shared_ptr<cppcms::sessions::session_storage> *in_stack_fffffffffffffef0;
  
  std::shared_ptr<cppcms::sessions::session_storage>::shared_ptr
            ((shared_ptr<cppcms::sessions::session_storage> *)in_stack_ffffffffffffeb70,
             in_stack_ffffffffffffeb68);
  test(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  std::shared_ptr<cppcms::sessions::session_storage>::~shared_ptr
            ((shared_ptr<cppcms::sessions::session_storage> *)0x10c0be);
  uVar5 = (**(code **)(*in_RSI + 8))();
  if ((uVar5 & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar6 = std::operator<<((ostream *)local_1a8,"Error ");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/storage_test.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,99);
    std::operator<<(poVar6," f.requires_gc()");
    local_1c9 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_1c8);
    local_1c9 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_1d8 = time((time_t *)0x0);
  peVar8 = std::
           __shared_ptr_access<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x10c2a6);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffeb9c,in_stack_ffffffffffffeb98),
                 in_stack_ffffffffffffeb90);
  tVar1 = local_1d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_218,"test",&local_219);
  (**peVar8->_vptr_session_storage)(peVar8,local_1f8,tVar1,local_218);
  std::__cxx11::string::~string(local_218);
  std::allocator<char>::~allocator((allocator<char> *)&local_219);
  std::__cxx11::string::~string(local_1f8);
  iVar3 = count_files();
  if (iVar3 != 1) {
    std::__cxx11::ostringstream::ostringstream(local_398);
    poVar6 = std::operator<<((ostream *)local_398,"Error ");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/storage_test.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x66);
    std::operator<<(poVar6," count_files()==1");
    local_3b9 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_3b8);
    local_3b9 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  peVar8 = std::
           __shared_ptr_access<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x10c55a);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffeb9c,in_stack_ffffffffffffeb98),
                 in_stack_ffffffffffffeb90);
  (*peVar8->_vptr_session_storage[2])(peVar8,local_3e0);
  std::__cxx11::string::~string(local_3e0);
  iVar3 = count_files();
  if (iVar3 != 0) {
    std::__cxx11::ostringstream::ostringstream(local_558);
    poVar6 = std::operator<<((ostream *)local_558,"Error ");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/storage_test.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x68);
    std::operator<<(poVar6," count_files()==0");
    local_579 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_578);
    local_579 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  peVar8 = std::
           __shared_ptr_access<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x10c77a);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffeb9c,in_stack_ffffffffffffeb98),
                 in_stack_ffffffffffffeb90);
  lVar9 = local_1d8 + -1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5c0,"test",&local_5c1);
  (**peVar8->_vptr_session_storage)(peVar8,local_5a0,lVar9,local_5c0);
  std::__cxx11::string::~string(local_5c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
  std::__cxx11::string::~string(local_5a0);
  peVar8 = std::
           __shared_ptr_access<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x10c841);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffeb9c,in_stack_ffffffffffffeb98),
                 in_stack_ffffffffffffeb90);
  lVar9 = local_1d8 + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_608,"test2",&local_609);
  (**peVar8->_vptr_session_storage)(peVar8,local_5e8,lVar9,local_608);
  std::__cxx11::string::~string(local_608);
  std::allocator<char>::~allocator((allocator<char> *)&local_609);
  std::__cxx11::string::~string(local_5e8);
  iVar3 = count_files();
  if (iVar3 != 2) {
    std::__cxx11::ostringstream::ostringstream(local_788);
    poVar6 = std::operator<<((ostream *)local_788,"Error ");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/storage_test.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x6b);
    std::operator<<(poVar6," count_files()==2");
    local_7a9 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_7a8);
    local_7a9 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  (**(code **)(*in_RSI + 0x10))();
  iVar3 = count_files();
  if (iVar3 != 1) {
    std::__cxx11::ostringstream::ostringstream(local_928);
    poVar6 = std::operator<<((ostream *)local_928,"Error ");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/storage_test.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x6d);
    std::operator<<(poVar6," count_files()==1");
    local_949 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_948);
    local_949 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string(local_970);
  peVar8 = std::
           __shared_ptr_access<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x10cd07);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffeb9c,in_stack_ffffffffffffeb98),
                 in_stack_ffffffffffffeb90);
  iVar3 = (*peVar8->_vptr_session_storage[1])(peVar8,local_998,&local_978,local_970);
  std::__cxx11::string::~string(local_998);
  if ((((byte)iVar3 ^ 0xff) & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_b10);
    poVar6 = std::operator<<((ostream *)local_b10,"Error ");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/storage_test.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x70);
    std::operator<<(poVar6," !storage->load(bs+\"1\",ttime,tstr)");
    local_b31 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_b30);
    local_b31 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  peVar8 = std::
           __shared_ptr_access<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x10cf60);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffeb9c,in_stack_ffffffffffffeb98),
                 in_stack_ffffffffffffeb90);
  uVar4 = (*peVar8->_vptr_session_storage[1])(peVar8,local_b58,&local_978,local_970);
  std::__cxx11::string::~string(local_b58);
  if ((uVar4 & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_cd0);
    poVar6 = std::operator<<((ostream *)local_cd0,"Error ");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/storage_test.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x71);
    std::operator<<(poVar6," storage->load(bs+\"2\",ttime,tstr)");
    local_cf1 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_cf0);
    local_cf1 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((local_978 == local_1d8 + 1) &&
     (bVar2 = std::operator==(in_stack_ffffffffffffeb70,(char *)in_stack_ffffffffffffeb68), bVar2))
  {
    peVar8 = std::
             __shared_ptr_access<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x10d35d);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffeb9c,in_stack_ffffffffffffeb98),
                   in_stack_ffffffffffffeb90);
    lVar9 = local_1d8 + -1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_ed8,"test2",&local_ed9);
    (**peVar8->_vptr_session_storage)(peVar8,local_eb8,lVar9,local_ed8);
    std::__cxx11::string::~string(local_ed8);
    std::allocator<char>::~allocator((allocator<char> *)&local_ed9);
    std::__cxx11::string::~string(local_eb8);
    iVar3 = count_files();
    if (iVar3 != 1) {
      std::__cxx11::ostringstream::ostringstream(local_1058);
      poVar6 = std::operator<<((ostream *)local_1058,"Error ");
      poVar6 = std::operator<<(poVar6,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/storage_test.cpp"
                              );
      poVar6 = std::operator<<(poVar6,":");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x74);
      std::operator<<(poVar6," count_files()==1");
      local_1079 = 1;
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar7,local_1078);
      local_1079 = 0;
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    (**(code **)(*in_RSI + 0x10))();
    iVar3 = count_files();
    if (iVar3 != 0) {
      std::__cxx11::ostringstream::ostringstream(local_11f8);
      poVar6 = std::operator<<((ostream *)local_11f8,"Error ");
      poVar6 = std::operator<<(poVar6,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/storage_test.cpp"
                              );
      poVar6 = std::operator<<(poVar6,":");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x76);
      std::operator<<(poVar6," count_files()==0");
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar7,local_1218);
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::~string(local_970);
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_e70);
  poVar6 = std::operator<<((ostream *)local_e70,"Error ");
  poVar6 = std::operator<<(poVar6,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/storage_test.cpp"
                          );
  poVar6 = std::operator<<(poVar6,":");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x72);
  std::operator<<(poVar6," ttime==now+1 && tstr==\"test2\"");
  local_e91 = 1;
  prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::runtime_error::runtime_error(prVar7,local_e90);
  local_e91 = 0;
  __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void test_files(booster::shared_ptr<cppcms::sessions::session_storage> storage,
		cppcms::sessions::session_storage_factory &f)
{
	test(storage,f);
	TEST(f.requires_gc());
	time_t now=time(0);
	storage->save(bs+"1",now,"test");
	TEST(count_files()==1);
	storage->remove(bs+"1");
	TEST(count_files()==0);
	storage->save(bs+"1",now-1,"test");
	storage->save(bs+"2",now+1,"test2");
	TEST(count_files()==2);
	f.gc_job();
	TEST(count_files()==1);
	std::string tstr;
	time_t ttime;
	TEST(!storage->load(bs+"1",ttime,tstr));
	TEST(storage->load(bs+"2",ttime,tstr));
	TEST(ttime==now+1 && tstr=="test2");
	storage->save(bs+"2",now-1,"test2");
	TEST(count_files()==1);
	f.gc_job();
	TEST(count_files()==0);
}